

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O2

void __thiscall Future<void>::startProc(Future<void> *this,_func_void_void_ptr *proc,void *args)

{
  uint uVar1;
  ThreadPool *pTVar2;
  bool bVar3;
  
  if (Private::_threadPool == (ThreadPool *)0x0) {
    do {
      LOCK();
      UNLOCK();
      bVar3 = Private::_threadPoolLock != 0;
      Private::_threadPoolLock = 1;
    } while (bVar3);
    pTVar2 = (ThreadPool *)operator_new(0x248);
    uVar1 = System::getProcessorCount();
    Private::ThreadPool::ThreadPool(pTVar2,0,(ulong)uVar1,0x100);
    LOCK();
    UNLOCK();
    Private::_threadPoolLock = 0;
    Private::_threadPool = pTVar2;
  }
  pTVar2 = Private::_threadPool;
  join(this);
  this->_joinable = true;
  this->_aborting = false;
  Private::ThreadPool::run(pTVar2,proc,args);
  return;
}

Assistant:

void Future<void>::startProc(void (*proc)(void *), void *args)
{
  Private::ThreadPool *threadPool = Private::_threadPool;
  if (!threadPool)
  {
    while (Atomic::testAndSet(Private::_threadPoolLock) != 0)
      ;
    if (!(threadPool = Private::_threadPool))
    {
      threadPool = new Private::ThreadPool;
      Atomic::swap(Private::_threadPool, threadPool);
    }
    Private::_threadPoolLock = 0;
  }

  join();
  _joinable = true;
  _aborting = false;
  threadPool->run(proc, args);
}